

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallImportedRuntimeArtifactsGenerator.h
# Opt level: O0

void __thiscall
cmInstallImportedRuntimeArtifactsGenerator::~cmInstallImportedRuntimeArtifactsGenerator
          (cmInstallImportedRuntimeArtifactsGenerator *this)

{
  cmInstallImportedRuntimeArtifactsGenerator *this_local;
  
  (this->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallImportedRuntimeArtifactsGenerator_017ddb48;
  std::__cxx11::string::~string((string *)&this->FilePermissions);
  std::__cxx11::string::~string((string *)&this->TargetName);
  cmInstallGenerator::~cmInstallGenerator(&this->super_cmInstallGenerator);
  return;
}

Assistant:

~cmInstallImportedRuntimeArtifactsGenerator() override = default;